

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

void * __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::$_4>::operator()
          (CreateLeafExt<void*,embree::sse2::rtcBuildBVHSpatialSAH(RTCBuildArguments_const*)::__4>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  void *pvVar1;
  ulong uVar2;
  undefined1 *puVar3;
  
  uVar2 = range->_begin;
  puVar3 = (undefined1 *)((long)&prims[uVar2].lower.field_0 + 0xc);
  for (; uVar2 < range->_end; uVar2 = uVar2 + 1) {
    puVar3[3] = puVar3[3] & 7;
    puVar3 = puVar3 + 0x20;
  }
  pvVar1 = (void *)(*(code *)**(undefined8 **)this)
                             (&alloc,prims + range->_begin,range->_end - range->_begin,
                              **(undefined8 **)(this + 8));
  return pvVar1;
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }